

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageFormatTests.cpp
# Opt level: O2

bool __thiscall
deqp::egl::Image::GLES2ImageApi::Create::invokeGLES2
          (Create *this,GLES2ImageApi *api,
          MovePtr<eglu::UniqueImage,_de::DefaultDeleter<eglu::UniqueImage>_> *image,Texture2D *ref)

{
  ImageSource *pIVar1;
  undefined1 auVar2 [16];
  UniquePtr<deqp::egl::Image::ClientBuffer,_de::DefaultDeleter<deqp::egl::Image::ClientBuffer>_>
  buffer;
  UniqueImage *in_stack_ffffffffffffffb8;
  ulong in_stack_ffffffffffffffc0;
  UniqueBase<deqp::egl::Image::ClientBuffer,_de::DefaultDeleter<deqp::egl::Image::ClientBuffer>_>
  local_38;
  
  pIVar1 = (this->m_imgSource).
           super_UniqueBase<deqp::egl::Image::ImageSource,_de::DefaultDeleter<deqp::egl::Image::ImageSource>_>
           .m_data.ptr;
  (*pIVar1->_vptr_ImageSource[3])(&stack0xffffffffffffffb8,pIVar1,api->m_gl);
  de::details::
  UniqueBase<deqp::egl::Image::ClientBuffer,_de::DefaultDeleter<deqp::egl::Image::ClientBuffer>_>::
  ~UniqueBase((UniqueBase<deqp::egl::Image::ClientBuffer,_de::DefaultDeleter<deqp::egl::Image::ClientBuffer>_>
               *)&stack0xffffffffffffffb8);
  createImage((MovePtr<eglu::UniqueImage,_de::DefaultDeleter<eglu::UniqueImage>_> *)
              &stack0xffffffffffffffb8,api,
              (this->m_imgSource).
              super_UniqueBase<deqp::egl::Image::ImageSource,_de::DefaultDeleter<deqp::egl::Image::ImageSource>_>
              .m_data.ptr,(ClientBuffer *)in_stack_ffffffffffffffb8);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = in_stack_ffffffffffffffc0;
  de::details::UniqueBase<eglu::UniqueImage,_de::DefaultDeleter<eglu::UniqueImage>_>::assignData
            (&image->super_UniqueBase<eglu::UniqueImage,_de::DefaultDeleter<eglu::UniqueImage>_>,
             (PtrData<eglu::UniqueImage,_de::DefaultDeleter<eglu::UniqueImage>_>)(auVar2 << 0x40));
  de::details::UniqueBase<eglu::UniqueImage,_de::DefaultDeleter<eglu::UniqueImage>_>::~UniqueBase
            ((UniqueBase<eglu::UniqueImage,_de::DefaultDeleter<eglu::UniqueImage>_> *)
             &stack0xffffffffffffffb8);
  de::details::
  UniqueBase<deqp::egl::Image::ClientBuffer,_de::DefaultDeleter<deqp::egl::Image::ClientBuffer>_>::
  ~UniqueBase(&local_38);
  return true;
}

Assistant:

bool GLES2ImageApi::Create::invokeGLES2 (GLES2ImageApi& api, MovePtr<UniqueImage>& image, tcu::Texture2D& ref) const
{
	de::UniquePtr<ClientBuffer>	buffer	(m_imgSource->createBuffer(api.m_gl, &ref));
	image = api.createImage(*m_imgSource, *buffer);
	return true;
}